

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.cpp
# Opt level: O0

void __thiscall libtorrent::aux::chained_buffer::clear(chained_buffer *this)

{
  bool bVar1;
  reference pbVar2;
  buffer_t *b;
  iterator __end2;
  iterator __begin2;
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  *__range2;
  chained_buffer *this_local;
  
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::begin((iterator *)&__end2._M_node,&this->m_vec);
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::end((iterator *)&b,&this->m_vec);
  while( true ) {
    bVar1 = ::std::operator!=((_Self *)&__end2._M_node,(_Self *)&b);
    if (!bVar1) break;
    pbVar2 = ::std::
             _Deque_iterator<libtorrent::aux::chained_buffer::buffer_t,_libtorrent::aux::chained_buffer::buffer_t_&,_libtorrent::aux::chained_buffer::buffer_t_*>
             ::operator*((_Deque_iterator<libtorrent::aux::chained_buffer::buffer_t,_libtorrent::aux::chained_buffer::buffer_t_&,_libtorrent::aux::chained_buffer::buffer_t_*>
                          *)&__end2._M_node);
    (*pbVar2->destruct_holder)(&pbVar2->holder);
    ::std::
    _Deque_iterator<libtorrent::aux::chained_buffer::buffer_t,_libtorrent::aux::chained_buffer::buffer_t_&,_libtorrent::aux::chained_buffer::buffer_t_*>
    ::operator++((_Deque_iterator<libtorrent::aux::chained_buffer::buffer_t,_libtorrent::aux::chained_buffer::buffer_t_&,_libtorrent::aux::chained_buffer::buffer_t_*>
                  *)&__end2._M_node);
  }
  this->m_bytes = 0;
  this->m_capacity = 0;
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::clear(&this->m_vec);
  return;
}

Assistant:

void chained_buffer::clear()
	{
		TORRENT_ASSERT(!m_destructed);
		for (auto& b : m_vec)
			b.destruct_holder(static_cast<void*>(&b.holder));
		m_bytes = 0;
		m_capacity = 0;
		m_vec.clear();
	}